

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to4_avx
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 *puVar4;
  uint _w;
  ulong uVar5;
  int i;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  int i_1;
  undefined4 *puVar11;
  long lVar12;
  ulong uVar13;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar10 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 0x40,inch / 8,(int)(char)((char)(outch % 8) / '\x04') + outch / 8,4,
              (Allocator *)0x0);
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  uVar5 = (ulong)_w;
  if ((int)_w < 1) {
    uVar5 = uVar10;
  }
  for (; (long)(uVar10 | 7) < (long)outch; uVar10 = uVar10 + 8) {
    pvVar7 = (void *)((uVar10 >> 3) * sVar2 * sVar3 + (long)pvVar1);
    for (uVar8 = 0; (long)(uVar8 | 7) < (long)inch; uVar8 = uVar8 + 8) {
      puVar4 = (undefined4 *)
               (((long)local_78.w * uVar8 + uVar10 * local_78.cstep) * local_78.elemsize +
               (long)local_78.data);
      for (uVar13 = 0; uVar13 != uVar5; uVar13 = uVar13 + 1) {
        puVar9 = puVar4;
        for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
          puVar11 = puVar9;
          for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 4) {
            *(undefined4 *)((long)pvVar7 + lVar12) = *puVar11;
            puVar11 = (undefined4 *)((long)puVar11 + local_78.cstep * local_78.elemsize);
          }
          puVar9 = (undefined4 *)((long)puVar9 + local_78.elemsize * (long)local_78.w);
          pvVar7 = (void *)((long)pvVar7 + 0x20);
        }
        puVar4 = puVar4 + 1;
      }
    }
  }
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  for (; (long)(uVar10 | 3) < (long)outch; uVar10 = uVar10 + 4) {
    pvVar7 = (void *)((ulong)(((uint)(uVar10 >> 3) & 0x1fffffff) +
                             (uint)(((uint)uVar10 >> 2 & 1) != 0)) * sVar2 * sVar3 + (long)pvVar1);
    for (uVar8 = 0; (long)(uVar8 | 7) < (long)inch; uVar8 = uVar8 + 8) {
      puVar4 = (undefined4 *)
               (((long)local_78.w * uVar8 + uVar10 * local_78.cstep) * local_78.elemsize +
               (long)local_78.data);
      for (uVar13 = 0; uVar13 != uVar5; uVar13 = uVar13 + 1) {
        puVar9 = puVar4;
        for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
          puVar11 = puVar9;
          for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 4) {
            *(undefined4 *)((long)pvVar7 + lVar12) = *puVar11;
            puVar11 = (undefined4 *)((long)puVar11 + local_78.cstep * local_78.elemsize);
          }
          puVar9 = (undefined4 *)((long)puVar9 + local_78.elemsize * (long)local_78.w);
          pvVar7 = (void *)((long)pvVar7 + 0x10);
        }
        puVar4 = puVar4 + 1;
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to4_avx(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8b-8a-maxk-inch/8a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(64 * maxk, inch / 8, outch / 8 + (outch % 8) / 4, (size_t)4u);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
}